

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O2

int32_t __thiscall
icu_63::KhmerBreakEngine::divideUpDictionaryRange
          (KhmerBreakEngine *this,UText *text,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  bool bVar1;
  ulong uVar2;
  UBool UVar3;
  int32_t iVar4;
  int32_t iVar5;
  int iVar6;
  UChar32 c;
  UChar32 UVar7;
  long lVar8;
  int64_t iVar9;
  int64_t iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  PossibleWord *this_00;
  UErrorCode status;
  int64_t local_290;
  UVector32 *local_288;
  PossibleWord *local_280;
  ulong local_278;
  UnicodeSet *local_270;
  UnicodeSet *local_268 [2];
  PossibleWord words [3];
  
  iVar4 = 0;
  if (3 < rangeEnd - rangeStart) {
    status = U_ZERO_ERROR;
    lVar8 = 0x10;
    do {
      *(undefined8 *)((long)local_268 + lVar8) = 0;
      *(undefined8 *)((long)words[0].cuLengths + lVar8 + -0x1c) = 0xffffffff;
      *(undefined4 *)((long)words[0].cuLengths + lVar8 + -0x14) = 0;
      lVar8 = lVar8 + 0xb4;
    } while (lVar8 != 0x22c);
    utext_setNativeIndex_63(text,(long)rangeStart);
    local_268[0] = &this->fEndWordSet;
    local_270 = &this->fBeginWordSet;
    local_268[1] = &this->fMarkSet;
    uVar11 = 0;
    local_288 = foundBreaks;
    while ((status < U_ILLEGAL_ARGUMENT_ERROR &&
           (local_290 = utext_getNativeIndex_63(text), (int)local_290 < rangeEnd))) {
      uVar2 = (ulong)uVar11 % 3;
      this_00 = words + uVar2;
      iVar4 = PossibleWord::candidates(this_00,text,this->fDictionary,rangeEnd);
      if (iVar4 == 1) {
LAB_002ca5ec:
        iVar4 = PossibleWord::acceptMarked(this_00,text);
        uVar11 = uVar11 + 1;
        bVar1 = words[uVar2].cpLengths[words[uVar2].mark] < 3;
      }
      else {
        if (1 < iVar4) {
          iVar9 = utext_getNativeIndex_63(text);
          if ((int)iVar9 < rangeEnd) {
            do {
              iVar4 = PossibleWord::candidates
                                (words + (ulong)(uVar11 + 1) % 3,text,this->fDictionary,rangeEnd);
              if (0 < iVar4) {
                words[uVar2].mark = words[uVar2].current;
                iVar9 = utext_getNativeIndex_63(text);
                if (rangeEnd <= (int)iVar9) break;
                do {
                  iVar4 = PossibleWord::candidates
                                    (words + (ulong)(uVar11 + 2) % 3,text,this->fDictionary,rangeEnd
                                    );
                  if (iVar4 != 0) {
                    words[uVar2].mark = words[uVar2].current;
                    goto LAB_002ca5ec;
                  }
                  UVar3 = PossibleWord::backUp(words + (ulong)(uVar11 + 1) % 3,text);
                } while (UVar3 != '\0');
              }
              UVar3 = PossibleWord::backUp(this_00,text);
            } while (UVar3 != '\0');
          }
          goto LAB_002ca5ec;
        }
        bVar1 = true;
        iVar4 = 0;
      }
      iVar9 = utext_getNativeIndex_63(text);
      if ((bVar1) && ((int)iVar9 < rangeEnd)) {
        iVar5 = PossibleWord::candidates(words + (ulong)uVar11 % 3,text,this->fDictionary,rangeEnd);
        if ((iVar5 < 1) && ((iVar4 == 0 || (words[(ulong)uVar11 % 3].prefix < 3)))) {
          uVar12 = iVar4 + (int)local_290;
          local_278 = (ulong)uVar12;
          iVar13 = 0;
          local_280 = words + (ulong)(uVar11 + 1) % 3;
          iVar14 = rangeEnd - uVar12;
          do {
            do {
              iVar9 = utext_getNativeIndex_63(text);
              UVar7 = utext_next32_63(text);
              iVar10 = utext_getNativeIndex_63(text);
              iVar6 = (int)iVar10 - (int)iVar9;
              iVar13 = iVar13 + iVar6;
              iVar15 = iVar14 - iVar6;
              if (iVar15 == 0 || iVar14 < iVar6) goto LAB_002ca823;
              c = utext_current32_63(text);
              UVar3 = UnicodeSet::contains(local_268[0],UVar7);
              iVar14 = iVar15;
            } while ((UVar3 == '\0') || (UVar3 = UnicodeSet::contains(local_270,c), UVar3 == '\0'));
            iVar5 = PossibleWord::candidates(local_280,text,this->fDictionary,rangeEnd);
            utext_setNativeIndex_63(text,(long)((int)local_278 + iVar13));
          } while (iVar5 < 1);
LAB_002ca823:
          uVar11 = uVar11 + (iVar4 < 1);
          iVar4 = iVar13 + iVar4;
          foundBreaks = local_288;
        }
        else {
          utext_setNativeIndex_63(text,(long)((int)local_290 + iVar4));
        }
      }
      while( true ) {
        iVar9 = utext_getNativeIndex_63(text);
        if (rangeEnd <= (int)iVar9) break;
        UVar7 = utext_current32_63(text);
        UVar3 = UnicodeSet::contains(local_268[1],UVar7);
        if (UVar3 == '\0') break;
        utext_next32_63(text);
        iVar10 = utext_getNativeIndex_63(text);
        iVar4 = (iVar4 - (int)iVar9) + (int)iVar10;
      }
      if (0 < iVar4) {
        UVector32::addElement(foundBreaks,iVar4 + (int)local_290,&status);
      }
    }
    iVar14 = foundBreaks->count;
    if ((long)iVar14 < 1) {
      if (0 < rangeEnd) {
        return uVar11;
      }
    }
    else {
      if (foundBreaks->elements[(long)iVar14 + -1] < rangeEnd) {
        return uVar11;
      }
      foundBreaks->count = iVar14 + -1;
    }
    iVar4 = uVar11 - 1;
  }
  return iVar4;
}

Assistant:

int32_t
KhmerBreakEngine::divideUpDictionaryRange( UText *text,
                                                int32_t rangeStart,
                                                int32_t rangeEnd,
                                                UVector32 &foundBreaks ) const {
    if ((rangeEnd - rangeStart) < KHMER_MIN_WORD_SPAN) {
        return 0;       // Not enough characters for two words
    }

    uint32_t wordsFound = 0;
    int32_t cpWordLength = 0;
    int32_t cuWordLength = 0;
    int32_t current;
    UErrorCode status = U_ZERO_ERROR;
    PossibleWord words[KHMER_LOOKAHEAD];

    utext_setNativeIndex(text, rangeStart);

    while (U_SUCCESS(status) && (current = (int32_t)utext_getNativeIndex(text)) < rangeEnd) {
        cuWordLength = 0;
        cpWordLength = 0;

        // Look for candidate words at the current position
        int32_t candidates = words[wordsFound%KHMER_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);

        // If we found exactly one, use that
        if (candidates == 1) {
            cuWordLength = words[wordsFound % KHMER_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % KHMER_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }

        // If there was more than one, see which one can take us forward the most words
        else if (candidates > 1) {
            // If we're already at the end of the range, we're done
            if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                goto foundBest;
            }
            do {
                int32_t wordsMatched = 1;
                if (words[(wordsFound + 1) % KHMER_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) > 0) {
                    if (wordsMatched < 2) {
                        // Followed by another dictionary word; mark first word as a good candidate
                        words[wordsFound % KHMER_LOOKAHEAD].markCurrent();
                        wordsMatched = 2;
                    }

                    // If we're already at the end of the range, we're done
                    if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                        goto foundBest;
                    }

                    // See if any of the possible second words is followed by a third word
                    do {
                        // If we find a third word, stop right away
                        if (words[(wordsFound + 2) % KHMER_LOOKAHEAD].candidates(text, fDictionary, rangeEnd)) {
                            words[wordsFound % KHMER_LOOKAHEAD].markCurrent();
                            goto foundBest;
                        }
                    }
                    while (words[(wordsFound + 1) % KHMER_LOOKAHEAD].backUp(text));
                }
            }
            while (words[wordsFound % KHMER_LOOKAHEAD].backUp(text));
foundBest:
            cuWordLength = words[wordsFound % KHMER_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % KHMER_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }

        // We come here after having either found a word or not. We look ahead to the
        // next word. If it's not a dictionary word, we will combine it with the word we
        // just found (if there is one), but only if the preceding word does not exceed
        // the threshold.
        // The text iterator should now be positioned at the end of the word we found.
        if ((int32_t)utext_getNativeIndex(text) < rangeEnd && cpWordLength < KHMER_ROOT_COMBINE_THRESHOLD) {
            // if it is a dictionary word, do nothing. If it isn't, then if there is
            // no preceding word, or the non-word shares less than the minimum threshold
            // of characters with a dictionary word, then scan to resynchronize
            if (words[wordsFound % KHMER_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
                  && (cuWordLength == 0
                      || words[wordsFound % KHMER_LOOKAHEAD].longestPrefix() < KHMER_PREFIX_COMBINE_THRESHOLD)) {
                // Look for a plausible word boundary
                int32_t remaining = rangeEnd - (current+cuWordLength);
                UChar32 pc;
                UChar32 uc;
                int32_t chars = 0;
                for (;;) {
                    int32_t pcIndex = (int32_t)utext_getNativeIndex(text);
                    pc = utext_next32(text);
                    int32_t pcSize = (int32_t)utext_getNativeIndex(text) - pcIndex;
                    chars += pcSize;
                    remaining -= pcSize;
                    if (remaining <= 0) {
                        break;
                    }
                    uc = utext_current32(text);
                    if (fEndWordSet.contains(pc) && fBeginWordSet.contains(uc)) {
                        // Maybe. See if it's in the dictionary.
                        int32_t num_candidates = words[(wordsFound + 1) % KHMER_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
                        utext_setNativeIndex(text, current+cuWordLength+chars);
                        if (num_candidates > 0) {
                            break;
                        }
                    }
                }

                // Bump the word count if there wasn't already one
                if (cuWordLength <= 0) {
                    wordsFound += 1;
                }

                // Update the length with the passed-over characters
                cuWordLength += chars;
            }
            else {
                // Back up to where we were for next iteration
                utext_setNativeIndex(text, current+cuWordLength);
            }
        }

        // Never stop before a combining mark.
        int32_t currPos;
        while ((currPos = (int32_t)utext_getNativeIndex(text)) < rangeEnd && fMarkSet.contains(utext_current32(text))) {
            utext_next32(text);
            cuWordLength += (int32_t)utext_getNativeIndex(text) - currPos;
        }

        // Look ahead for possible suffixes if a dictionary word does not follow.
        // We do this in code rather than using a rule so that the heuristic
        // resynch continues to function. For example, one of the suffix characters
        // could be a typo in the middle of a word.
//        if ((int32_t)utext_getNativeIndex(text) < rangeEnd && wordLength > 0) {
//            if (words[wordsFound%KHMER_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
//                && fSuffixSet.contains(uc = utext_current32(text))) {
//                if (uc == KHMER_PAIYANNOI) {
//                    if (!fSuffixSet.contains(utext_previous32(text))) {
//                        // Skip over previous end and PAIYANNOI
//                        utext_next32(text);
//                        utext_next32(text);
//                        wordLength += 1;            // Add PAIYANNOI to word
//                        uc = utext_current32(text);     // Fetch next character
//                    }
//                    else {
//                        // Restore prior position
//                        utext_next32(text);
//                    }
//                }
//                if (uc == KHMER_MAIYAMOK) {
//                    if (utext_previous32(text) != KHMER_MAIYAMOK) {
//                        // Skip over previous end and MAIYAMOK
//                        utext_next32(text);
//                        utext_next32(text);
//                        wordLength += 1;            // Add MAIYAMOK to word
//                    }
//                    else {
//                        // Restore prior position
//                        utext_next32(text);
//                    }
//                }
//            }
//            else {
//                utext_setNativeIndex(text, current+wordLength);
//            }
//        }

        // Did we find a word on this iteration? If so, push it on the break stack
        if (cuWordLength > 0) {
            foundBreaks.push((current+cuWordLength), status);
        }
    }
    
    // Don't return a break for the end of the dictionary range if there is one there.
    if (foundBreaks.peeki() >= rangeEnd) {
        (void) foundBreaks.popi();
        wordsFound -= 1;
    }

    return wordsFound;
}